

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O3

avl_node_t * avl_rotate_LL(avl_node_t *parent)

{
  avl_node_t *paVar1;
  avl_node *paVar2;
  uint uVar3;
  uint uVar4;
  
  paVar1 = parent->left;
  uVar4 = 0;
  uVar3 = 0;
  paVar2 = paVar1->right;
  parent->left = paVar2;
  paVar1->right = parent;
  if (paVar2 != (avl_node *)0x0) {
    uVar4 = paVar2->height;
  }
  if (parent->right != (avl_node *)0x0) {
    uVar3 = parent->right->height;
  }
  if ((int)uVar3 < (int)uVar4) {
    uVar3 = uVar4;
  }
  uVar3 = uVar3 + 1;
  parent->height = uVar3;
  if (paVar1->left == (avl_node *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = paVar1->left->height;
  }
  if ((int)uVar3 < (int)uVar4) {
    uVar3 = uVar4;
  }
  paVar1->height = uVar3 + 1;
  return paVar1;
}

Assistant:

static avl_node_t*
avl_rotate_LL(avl_node_t *parent)
{
    avl_node_t *child = parent->left;
    parent->left = child->right;
    child->right = parent;
    avl_update_height(parent);
    avl_update_height(child);
    return child;
}